

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed.c++
# Opt level: O0

void __thiscall capnp::_::PackedInputStream::skip(PackedInputStream *this,size_t bytes)

{
  byte bVar1;
  BufferedInputStream *pBVar2;
  uchar *puVar3;
  byte *pbVar4;
  size_t sVar5;
  ulong uVar6;
  size_t inRemaining;
  Fault f_7;
  uint runLength_1;
  Fault f_6;
  Fault f_5;
  uint runLength;
  Fault f_4;
  Fault f_3;
  Fault local_88;
  Fault f_2;
  uint local_6c;
  uint i;
  Fault f_1;
  byte local_49;
  byte *pbStack_48;
  uint8_t tag;
  uint8_t *in;
  ArrayPtr<const_unsigned_char> buffer;
  Fault local_20;
  Fault f;
  size_t bytes_local;
  PackedInputStream *this_local;
  
  if (bytes != 0) {
    f.exception = (Exception *)bytes;
    if ((bytes & 7) != 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[46]>
                (&local_20,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed.c++"
                 ,0xbe,FAILED,"bytes % sizeof(word) == 0",
                 "\"PackedInputStream reads must be word-aligned.\"",
                 (char (*) [46])"PackedInputStream reads must be word-aligned.");
      kj::_::Debug::Fault::fatal(&local_20);
    }
    _in = kj::BufferedInputStream::getReadBuffer(this->inner);
    pbStack_48 = kj::ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&in);
LAB_0046f128:
    do {
      puVar3 = kj::ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)&in);
      if ((ulong)((long)puVar3 - (long)pbStack_48) < 10) {
        pbVar4 = kj::ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)&in);
        if (pbVar4 == pbStack_48) {
          pBVar2 = this->inner;
          sVar5 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&in);
          (*(pBVar2->super_InputStream)._vptr_InputStream[3])(pBVar2,sVar5);
          _f_1 = kj::BufferedInputStream::getReadBuffer(this->inner);
          _in = _f_1;
          sVar5 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&in);
          if (sVar5 == 0) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
                      ((Fault *)&stack0xffffffffffffff98,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed.c++"
                       ,0xce,FAILED,"buffer.size() > 0","\"Premature end of packed input.\"",
                       (char (*) [31])"Premature end of packed input.");
            kj::_::Debug::Fault::~Fault((Fault *)&stack0xffffffffffffff98);
            return;
          }
          pbStack_48 = kj::ArrayPtr<const_unsigned_char>::begin
                                 ((ArrayPtr<const_unsigned_char> *)&in);
          goto LAB_0046f128;
        }
        local_49 = *pbStack_48;
        pbStack_48 = pbStack_48 + 1;
        for (local_6c = 0; local_6c < 8; local_6c = local_6c + 1) {
          if (((uint)local_49 & 1 << ((byte)local_6c & 0x1f)) != 0) {
            pbVar4 = kj::ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)&in);
            if (pbVar4 == pbStack_48) {
              pBVar2 = this->inner;
              sVar5 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&in);
              (*(pBVar2->super_InputStream)._vptr_InputStream[3])(pBVar2,sVar5);
              _f_2 = kj::BufferedInputStream::getReadBuffer(this->inner);
              _in = _f_2;
              sVar5 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&in);
              if (sVar5 == 0) {
                kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
                          (&local_88,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed.c++"
                           ,0xda,FAILED,"buffer.size() > 0","\"Premature end of packed input.\"",
                           (char (*) [31])"Premature end of packed input.");
                kj::_::Debug::Fault::~Fault(&local_88);
                return;
              }
              pbStack_48 = kj::ArrayPtr<const_unsigned_char>::begin
                                     ((ArrayPtr<const_unsigned_char> *)&in);
            }
            pbStack_48 = pbStack_48 + 1;
          }
        }
        f.exception = (Exception *)&f.exception[-1].traceCount;
        pbVar4 = kj::ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)&in);
        if ((pbVar4 == pbStack_48) && ((local_49 == 0 || (local_49 == 0xff)))) {
          pBVar2 = this->inner;
          sVar5 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&in);
          (*(pBVar2->super_InputStream)._vptr_InputStream[3])(pBVar2,sVar5);
          _in = kj::BufferedInputStream::getReadBuffer(this->inner);
          sVar5 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&in);
          if (sVar5 == 0) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
                      (&f_4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed.c++"
                       ,0xe2,FAILED,"buffer.size() > 0","\"Premature end of packed input.\"",
                       (char (*) [31])"Premature end of packed input.");
            kj::_::Debug::Fault::~Fault(&f_4);
            return;
          }
          pbStack_48 = kj::ArrayPtr<const_unsigned_char>::begin
                                 ((ArrayPtr<const_unsigned_char> *)&in);
        }
      }
      else {
        local_49 = *pbStack_48;
        pbStack_48 = pbStack_48 +
                     (long)(int)(uint)((local_49 & 0x80) != 0) +
                     (long)(int)(uint)((local_49 & 0x40) != 0) +
                     (long)(int)(uint)((local_49 & 0x20) != 0) +
                     (long)(int)(uint)((local_49 & 0x10) != 0) +
                     (long)(int)(uint)((local_49 & 8) != 0) +
                     (long)(int)(uint)((local_49 & 4) != 0) +
                     (long)(int)(uint)((local_49 & 2) != 0) +
                     (long)(int)(uint)((local_49 & 1) != 0) + 1;
        f.exception = (Exception *)&f.exception[-1].traceCount;
      }
      if (local_49 == 0) {
        pbVar4 = kj::ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)&in);
        if (pbVar4 == pbStack_48) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[42]>
                    ((Fault *)&stack0xffffffffffffff58,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed.c++"
                     ,0xf8,FAILED,"BUFFER_REMAINING > 0",
                     "\"Should always have non-empty buffer here.\"",
                     (char (*) [42])"Should always have non-empty buffer here.");
          kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffff58);
        }
        if (f.exception < (Exception *)((ulong)*pbStack_48 << 3)) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[56]>
                    (&f_6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed.c++"
                     ,0xfc,FAILED,"runLength <= bytes",
                     "\"Packed input did not end cleanly on a segment boundary.\"",
                     (char (*) [56])"Packed input did not end cleanly on a segment boundary.");
          kj::_::Debug::Fault::~Fault(&f_6);
          return;
        }
        f.exception = f.exception + (ulong)*pbStack_48 * -8;
        pbStack_48 = pbStack_48 + 1;
      }
      else if (local_49 == 0xff) {
        pbVar4 = kj::ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)&in);
        if (pbVar4 == pbStack_48) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[42]>
                    ((Fault *)&stack0xffffffffffffff40,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed.c++"
                     ,0x103,FAILED,"BUFFER_REMAINING > 0",
                     "\"Should always have non-empty buffer here.\"",
                     (char (*) [42])"Should always have non-empty buffer here.");
          kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffff40);
        }
        bVar1 = *pbStack_48;
        f_7.exception._4_4_ = (uint)bVar1 << 3;
        if (f.exception < (Exception *)((ulong)bVar1 << 3)) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[56]>
                    ((Fault *)&inRemaining,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed.c++"
                     ,0x107,FAILED,"runLength <= bytes",
                     "\"Packed input did not end cleanly on a segment boundary.\"",
                     (char (*) [56])"Packed input did not end cleanly on a segment boundary.");
          kj::_::Debug::Fault::~Fault((Fault *)&inRemaining);
          return;
        }
        f.exception = f.exception + (ulong)bVar1 * -8;
        puVar3 = kj::ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)&in);
        uVar6 = (long)puVar3 - (long)(pbStack_48 + 1);
        if (uVar6 <= f_7.exception._4_4_) {
          f_7.exception._4_4_ = f_7.exception._4_4_ - (int)uVar6;
          pBVar2 = this->inner;
          sVar5 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&in);
          (*(pBVar2->super_InputStream)._vptr_InputStream[3])(pBVar2,sVar5 + f_7.exception._4_4_);
          if (f.exception == (Exception *)0x0) {
            return;
          }
          _in = kj::BufferedInputStream::getReadBuffer(this->inner);
          pbStack_48 = kj::ArrayPtr<const_unsigned_char>::begin
                                 ((ArrayPtr<const_unsigned_char> *)&in);
          goto LAB_0046f128;
        }
        pbStack_48 = pbStack_48 + 1 + f_7.exception._4_4_;
      }
    } while (f.exception != (Exception *)0x0);
    pBVar2 = this->inner;
    puVar3 = kj::ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&in);
    (*(pBVar2->super_InputStream)._vptr_InputStream[3])(pBVar2,(long)pbStack_48 - (long)puVar3);
  }
  return;
}

Assistant:

void PackedInputStream::skip(size_t bytes) {
  // We can't just read into buffers because buffers must end on block boundaries.

  if (bytes == 0) {
    return;
  }

  KJ_DREQUIRE(bytes % sizeof(word) == 0, "PackedInputStream reads must be word-aligned.");

  kj::ArrayPtr<const byte> buffer = inner.getReadBuffer();
  const uint8_t* __restrict__ in = reinterpret_cast<const uint8_t*>(buffer.begin());

#define REFRESH_BUFFER() \
  inner.skip(buffer.size()); \
  buffer = inner.getReadBuffer(); \
  KJ_REQUIRE(buffer.size() > 0, "Premature end of packed input.") { return; } \
  in = reinterpret_cast<const uint8_t*>(buffer.begin())

  for (;;) {
    uint8_t tag;

    if (BUFFER_REMAINING < 10) {
      if (BUFFER_REMAINING == 0) {
        REFRESH_BUFFER();
        continue;
      }

      // We have at least 1, but not 10, bytes available.  We need to read slowly, doing a bounds
      // check on each byte.

      tag = *in++;

      for (uint i = 0; i < 8; i++) {
        if (tag & (1u << i)) {
          if (BUFFER_REMAINING == 0) {
            REFRESH_BUFFER();
          }
          in++;
        }
      }
      bytes -= 8;

      if (BUFFER_REMAINING == 0 && (tag == 0 || tag == 0xffu)) {
        REFRESH_BUFFER();
      }
    } else {
      tag = *in++;

#define HANDLE_BYTE(n) \
      in += (tag & (1u << n)) != 0

      HANDLE_BYTE(0);
      HANDLE_BYTE(1);
      HANDLE_BYTE(2);
      HANDLE_BYTE(3);
      HANDLE_BYTE(4);
      HANDLE_BYTE(5);
      HANDLE_BYTE(6);
      HANDLE_BYTE(7);
#undef HANDLE_BYTE

      bytes -= 8;
    }

    if (tag == 0) {
      KJ_DASSERT(BUFFER_REMAINING > 0, "Should always have non-empty buffer here.");

      uint runLength = *in++ * sizeof(word);

      KJ_REQUIRE(runLength <= bytes, "Packed input did not end cleanly on a segment boundary.") {
        return;
      }

      bytes -= runLength;

    } else if (tag == 0xffu) {
      KJ_DASSERT(BUFFER_REMAINING > 0, "Should always have non-empty buffer here.");

      uint runLength = *in++ * sizeof(word);

      KJ_REQUIRE(runLength <= bytes, "Packed input did not end cleanly on a segment boundary.") {
        return;
      }

      bytes -= runLength;

      size_t inRemaining = BUFFER_REMAINING;
      if (inRemaining > runLength) {
        // Fast path.
        in += runLength;
      } else {
        // Forward skip to the underlying stream.
        runLength -= inRemaining;
        inner.skip(buffer.size() + runLength);

        if (bytes == 0) {
          return;
        } else {
          buffer = inner.getReadBuffer();
          in = reinterpret_cast<const uint8_t*>(buffer.begin());

          // Skip the bounds check below since we just did the same check above.
          continue;
        }
      }
    }

    if (bytes == 0) {
      inner.skip(in - reinterpret_cast<const uint8_t*>(buffer.begin()));
      return;
    }
  }

  KJ_FAIL_ASSERT("Can't get here.");
}